

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Type __thiscall
wabt::anon_unknown_4::Validator::GetDeclarationType(Validator *this,FuncDeclaration *decl)

{
  pointer pTVar1;
  pointer pTVar2;
  int in_EDX;
  ulong uVar3;
  Type TStack_10;
  
  uVar3 = 0xffffffff00000000;
  if (decl->has_func_type == true) {
    TStack_10 = (Type)Var::index(&decl->type_var,(char *)&decl->type_var,in_EDX);
    goto LAB_001373fe;
  }
  if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar1 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar1 == pTVar2) {
      TStack_10.enum_ = Void;
      TStack_10.type_index_ = 0xffffffff;
      goto LAB_001373fe;
    }
    if ((long)pTVar2 - (long)pTVar1 == 8) {
      TStack_10 = *pTVar1;
      uVar3 = (ulong)TStack_10 & 0xffffffff00000000;
      goto LAB_001373fe;
    }
  }
  TStack_10.enum_ = Module::GetFuncTypeIndex(this->current_module_,decl);
  TStack_10.type_index_ = 0;
LAB_001373fe:
  return (Type)((ulong)TStack_10 & 0xffffffff | uVar3);
}

Assistant:

Type Validator::GetDeclarationType(const FuncDeclaration& decl) {
  if (decl.has_func_type) {
    return Type(decl.type_var.index());
  }
  if (decl.sig.param_types.empty()) {
    if (decl.sig.result_types.empty()) {
      return Type::Void;
    }
    if (decl.sig.result_types.size() == 1) {
      return decl.sig.result_types[0];
    }
  }
  return Type(current_module_->GetFuncTypeIndex(decl));
}